

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::escaped(sequence *__return_storage_ptr__,spec *s)

{
  initializer_list<unsigned_char> cs;
  sequence local_140;
  repeat_exact local_120;
  repeat_exact local_108;
  sequence local_f0;
  hexdig local_d0;
  character local_a8;
  character local_98;
  undefined1 local_88 [16];
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> local_78;
  either escape_seq;
  character_either escape_char;
  
  local_d0.super_scanner_base._vptr_scanner_base._0_7_ = 0x74726e66625c22;
  cs._M_len = 7;
  cs._M_array = (iterator)&local_d0;
  character_either::character_either(&escape_char,cs);
  if (s->v1_1_0_add_escape_sequence_e == true) {
    character_either::push_back(&escape_char,'e');
  }
  local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004e8900;
  local_98.value_ = 'u';
  hexdig::hexdig(&local_d0,s);
  repeat_exact::repeat_exact<toml::detail::syntax::hexdig>(&local_108,4,&local_d0);
  sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
            (&local_140,&local_98,&local_108);
  local_a8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004e8900;
  local_a8.value_ = 'U';
  hexdig::hexdig((hexdig *)local_88,s);
  repeat_exact::repeat_exact<toml::detail::syntax::hexdig>(&local_120,8,(hexdig *)local_88);
  sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
            (&local_f0,&local_a8,&local_120);
  either::either<toml::detail::character_either,toml::detail::sequence,toml::detail::sequence>
            (&escape_seq,&escape_char,&local_140,&local_f0);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_f0.others_);
  if (local_120.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_120.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_120.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_78);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_140.others_);
  if (local_108.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_108.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_108.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_d0.scanner_.others_);
  if (s->v1_1_0_add_escape_sequence_x == true) {
    local_f0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004e8900;
    local_f0.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x78;
    hexdig::hexdig(&local_d0,s);
    repeat_exact::repeat_exact<toml::detail::syntax::hexdig>((repeat_exact *)&local_140,2,&local_d0)
    ;
    sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
              ((sequence *)local_88,(character *)&local_f0,(repeat_exact *)&local_140);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::sequence>(&escape_seq.others_,(sequence *)local_88);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_88 + 8));
    if (local_140.others_.
        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      (**(code **)((long)((local_140.others_.
                           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
                         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> + 8))();
    }
    local_140.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_d0.scanner_.others_);
  }
  local_d0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004e8900;
  local_d0.scanner_.super_scanner_base._vptr_scanner_base._0_1_ = 0x5c;
  sequence::sequence<toml::detail::character,toml::detail::either>
            (__return_storage_ptr__,(character *)&local_d0,&escape_seq);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&escape_seq.others_);
  CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&escape_char.chars_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence escaped(const spec& s)
{
    character_either escape_char{
        '\"','\\', 'b', 'f', 'n', 'r', 't'
    };
    if(s.v1_1_0_add_escape_sequence_e)
    {
        escape_char.push_back(char_type('e'));
    }

    either escape_seq(
            std::move(escape_char),
            sequence(character('u'), repeat_exact(4, hexdig(s))),
            sequence(character('U'), repeat_exact(8, hexdig(s)))
        );

    if(s.v1_1_0_add_escape_sequence_x)
    {
        escape_seq.push_back(
            sequence(character('x'), repeat_exact(2, hexdig(s)))
        );
    }

    return sequence(
            character('\\'),
            std::move(escape_seq)
        );
}